

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O0

int VP8RecordCoeffs(int ctx,VP8Residual *res)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int *in_RSI;
  int in_EDI;
  int mask;
  int i;
  int pattern;
  int bits;
  int v;
  proba_t *s;
  int n;
  int local_30;
  uint local_2c;
  int local_24;
  proba_t *local_20;
  int local_14;
  int local_4;
  
  local_20 = (proba_t *)(*(long *)(in_RSI + 8) + (long)*in_RSI * 0x84 + (long)in_EDI * 0x2c);
  local_14 = *in_RSI;
  if (in_RSI[1] < 0) {
    VP8RecordStats(0,local_20);
    local_4 = 0;
  }
  else {
    while (local_14 <= in_RSI[1]) {
      VP8RecordStats(1,local_20);
      while( true ) {
        iVar3 = local_14 + 1;
        local_24 = (int)*(short *)(*(long *)(in_RSI + 2) + (long)local_14 * 2);
        local_14 = iVar3;
        if (local_24 != 0) break;
        VP8RecordStats(0,local_20 + 1);
        local_20 = (proba_t *)(*(long *)(in_RSI + 8) + (ulong)""[iVar3] * 0x84);
      }
      VP8RecordStats(1,local_20 + 1);
      iVar2 = VP8RecordStats((uint)(2 < local_24 + 1U),local_20 + 2);
      if (iVar2 == 0) {
        local_20 = (proba_t *)(*(long *)(in_RSI + 8) + (ulong)""[iVar3] * 0x84 + 0x2c);
      }
      else {
        if (local_24 < 1) {
          local_24 = -local_24;
        }
        if (0x43 < local_24) {
          local_24 = 0x43;
        }
        uVar1 = VP8LevelCodes[local_24 + -1][1];
        local_2c = (uint)VP8LevelCodes[local_24 + -1][0];
        local_30 = 0;
        while (local_2c = (int)local_2c >> 1, local_2c != 0) {
          if ((local_2c & 1) != 0) {
            VP8RecordStats((uint)(((uint)uVar1 & 2 << ((byte)local_30 & 0x1f)) != 0),
                           local_20 + (long)local_30 + 3);
          }
          local_30 = local_30 + 1;
        }
        local_20 = (proba_t *)(*(long *)(in_RSI + 8) + (ulong)""[iVar3] * 0x84 + 0x58);
      }
    }
    if (local_14 < 0x10) {
      VP8RecordStats(0,local_20);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int VP8RecordCoeffs(int ctx, const VP8Residual* const res) {
  int n = res->first;
  // should be stats[VP8EncBands[n]], but it's equivalent for n=0 or 1
  proba_t* s = res->stats[n][ctx];
  if (res->last  < 0) {
    VP8RecordStats(0, s + 0);
    return 0;
  }
  while (n <= res->last) {
    int v;
    VP8RecordStats(1, s + 0);  // order of record doesn't matter
    while ((v = res->coeffs[n++]) == 0) {
      VP8RecordStats(0, s + 1);
      s = res->stats[VP8EncBands[n]][0];
    }
    VP8RecordStats(1, s + 1);
    if (!VP8RecordStats(2u < (unsigned int)(v + 1), s + 2)) {  // v = -1 or 1
      s = res->stats[VP8EncBands[n]][1];
    } else {
      v = abs(v);
#if !defined(USE_LEVEL_CODE_TABLE)
      if (!VP8RecordStats(v > 4, s + 3)) {
        if (VP8RecordStats(v != 2, s + 4))
          VP8RecordStats(v == 4, s + 5);
      } else if (!VP8RecordStats(v > 10, s + 6)) {
        VP8RecordStats(v > 6, s + 7);
      } else if (!VP8RecordStats((v >= 3 + (8 << 2)), s + 8)) {
        VP8RecordStats((v >= 3 + (8 << 1)), s + 9);
      } else {
        VP8RecordStats((v >= 3 + (8 << 3)), s + 10);
      }
#else
      if (v > MAX_VARIABLE_LEVEL) {
        v = MAX_VARIABLE_LEVEL;
      }

      {
        const int bits = VP8LevelCodes[v - 1][1];
        int pattern = VP8LevelCodes[v - 1][0];
        int i;
        for (i = 0; (pattern >>= 1) != 0; ++i) {
          const int mask = 2 << i;
          if (pattern & 1) VP8RecordStats(!!(bits & mask), s + 3 + i);
        }
      }
#endif
      s = res->stats[VP8EncBands[n]][2];
    }
  }
  if (n < 16) VP8RecordStats(0, s + 0);
  return 1;
}